

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mergesort_lcp.cpp
# Opt level: O3

tuple<int,_unsigned_long> compare(uchar *a,uchar *b,size_t depth)

{
  byte bVar1;
  byte bVar2;
  long in_RCX;
  long lVar3;
  char *__assertion;
  tuple<int,_unsigned_long> tVar4;
  
  if (b == (uchar *)0x0) {
    __assertion = "a";
  }
  else {
    if (depth != 0) {
      lVar3 = in_RCX + -1;
      do {
        bVar1 = b[lVar3 + 1];
        bVar2 = *(byte *)(depth + 1 + lVar3);
        lVar3 = lVar3 + 1;
        if (bVar1 == 0) break;
      } while (bVar1 == bVar2);
      *(long *)a = lVar3;
      *(uint *)(a + 8) = (uint)bVar1 - (uint)bVar2;
      tVar4.super__Tuple_impl<0UL,_int,_unsigned_long>.super__Head_base<0UL,_int,_false>.
      _M_head_impl._0_1_ = bVar2;
      tVar4.super__Tuple_impl<0UL,_int,_unsigned_long>.super__Tuple_impl<1UL,_unsigned_long>.
      super__Head_base<1UL,_unsigned_long,_false>._M_head_impl =
           (_Head_base<1UL,_unsigned_long,_false>)(_Head_base<1UL,_unsigned_long,_false>)a;
      tVar4.super__Tuple_impl<0UL,_int,_unsigned_long>._9_7_ = 0;
      return (tuple<int,_unsigned_long>)tVar4.super__Tuple_impl<0UL,_int,_unsigned_long>;
    }
    __assertion = "b";
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                ,0x69,"std::tuple<int, lcp_t> compare(unsigned char *, unsigned char *, size_t)");
}

Assistant:

std::tuple<int, lcp_t>
compare(unsigned char* a, unsigned char* b, size_t depth=0)
{
	assert(a); assert(b);
	for (size_t i=depth; ; ++i) {
		const unsigned char A = a[i];
		const unsigned char B = b[i];
		if (A == 0 or A != B) {
			return std::make_tuple(int(A)-int(B), i);
		}
	}
	assert(0);
	return std::make_tuple(int(-1), lcp_t(-1));
}